

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O0

void __thiscall lsim::SimCircuit::write_byte(SimCircuit *this,pin_id_container_t *pins,uint8_t data)

{
  uint32_t uVar1;
  size_type sVar2;
  const_reference pvVar3;
  SimComponent *this_00;
  SimComponent *comp;
  ulong uStack_28;
  Value value;
  size_t idx;
  uint8_t data_local;
  pin_id_container_t *pins_local;
  SimCircuit *this_local;
  
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pins);
  if (sVar2 != 8) {
    __assert_fail("pins.size() == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                  ,0xbb,"void lsim::SimCircuit::write_byte(const pin_id_container_t &, uint8_t)");
  }
  uStack_28 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pins);
    if (sVar2 <= uStack_28) {
      return;
    }
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pins,uStack_28);
    uVar1 = component_id_from_pin_id(*pvVar3);
    this_00 = component_by_id(this,uVar1);
    if (this_00 == (SimComponent *)0x0) break;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pins,uStack_28);
    uVar1 = pin_index_from_pin_id(*pvVar3);
    SimComponent::set_user_value
              (this_00,uVar1,(int)(uint)data >> ((byte)uStack_28 & 0x1f) & VALUE_TRUE);
    uStack_28 = uStack_28 + 1;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0xc1,"void lsim::SimCircuit::write_byte(const pin_id_container_t &, uint8_t)");
}

Assistant:

void SimCircuit::write_byte(const pin_id_container_t &pins, uint8_t data) {
    assert(pins.size() == 8);

    for (size_t idx = 0; idx < pins.size(); ++idx) {
        auto value = static_cast<Value>((data >> idx) & 1);

        auto comp = component_by_id(component_id_from_pin_id(pins[idx]));
        assert(comp);
        comp->set_user_value(pin_index_from_pin_id(pins[idx]), value);
    }
}